

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  ushort uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  
  uVar11 = (uint)CONCAT71(in_register_00000009,typecode);
  if (uVar11 == 4) {
    uVar11 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  uVar6 = (ushort)range_start;
  if ((char)uVar11 == '\x03') {
    iVar5 = *c;
    iVar7 = 0;
    uVar11 = 0;
    if (0 < iVar5) {
      lVar2 = *(long *)((long)c + 8);
      iVar12 = iVar5 + -1;
      do {
        uVar11 = (uint)(iVar12 + iVar7) >> 1;
        uVar1 = *(ushort *)(lVar2 + (ulong)uVar11 * 4);
        if (uVar1 < uVar6) {
          iVar7 = uVar11 + 1;
        }
        else {
          if (uVar1 <= uVar6) goto LAB_0012216d;
          iVar12 = uVar11 - 1;
        }
      } while (iVar7 <= iVar12);
      if ((iVar7 == 0) ||
         (uVar11 = iVar7 - 1,
         (uint)*(ushort *)(lVar2 + 2 + (ulong)uVar11 * 4) <
         range_start - *(ushort *)(lVar2 + (ulong)uVar11 * 4))) {
        return false;
      }
LAB_0012216d:
      uVar10 = 0;
      if ((int)uVar11 < iVar5) {
        lVar2 = lVar2 + (long)(int)uVar11 * 4;
        lVar8 = 0;
        uVar10 = 0;
        do {
          uVar6 = *(ushort *)(lVar2 + lVar8 * 4);
          if (range_end <= uVar6) break;
          uVar1 = *(ushort *)(lVar2 + 2 + lVar8 * 4);
          if (range_end <= (uint)uVar1 + (uint)uVar6) {
            uVar10 = (uVar10 + range_end) - (uint)uVar6;
            break;
          }
          uVar14 = ((uint)uVar1 + (uint)uVar6) - range_start;
          if (uVar1 <= uVar14) {
            uVar14 = (uint)uVar1;
          }
          uVar10 = uVar10 + uVar14;
          lVar8 = lVar8 + 1;
        } while (iVar5 - uVar11 != (int)lVar8);
      }
      return ~range_start + range_end <= uVar10;
    }
  }
  else if ((uVar11 & 0xff) == 2) {
    iVar5 = range_end - range_start;
    if (iVar5 == 0 || (int)range_end < (int)range_start) {
      return true;
    }
    iVar7 = *c;
    uVar11 = 0;
    if (iVar5 <= iVar7) {
      iVar12 = iVar7 + -1;
      do {
        uVar10 = iVar12 + uVar11 >> 1;
        uVar1 = *(ushort *)(*(long *)((long)c + 8) + (ulong)(iVar12 + uVar11 & 0xfffffffe));
        if (uVar1 < uVar6) {
          uVar11 = uVar10 + 1;
        }
        else {
          if (uVar1 <= uVar6) {
            if (iVar7 < (int)(uVar10 + iVar5)) {
              return false;
            }
            bVar15 = *(short *)(*(long *)((long)c + 8) + -2 + (ulong)(uVar10 + iVar5) * 2) ==
                     (short)((short)range_end + -1);
            goto LAB_001221ff;
          }
          iVar12 = uVar10 - 1;
        }
        if (iVar12 < (int)uVar11) {
          return false;
        }
      } while( true );
    }
  }
  else {
    uVar9 = (ulong)(range_start >> 6);
    uVar13 = -1L << ((byte)range_start & 0x3f);
    uVar4 = -1L << ((byte)range_end & 0x3f);
    uVar10 = range_end >> 6;
    lVar2 = *(long *)((long)c + 8);
    uVar3 = *(ulong *)(lVar2 + uVar9 * 8);
    if (range_start >> 6 == uVar10) {
      bVar15 = (uVar13 & ~(uVar3 | uVar4)) == 0;
LAB_001221ff:
      uVar11 = (uint)bVar15;
    }
    else {
      if (uVar3 < uVar13) {
        return false;
      }
      if ((range_end < 0x10000) &&
         ((uVar4 | *(ulong *)(lVar2 + (ulong)uVar10 * 8)) != 0xffffffffffffffff)) {
        return false;
      }
      do {
        bVar15 = (ulong)uVar10 <= uVar9 + 1 || 0x3fe < uVar9;
        uVar11 = (uint)bVar15;
        if (bVar15) break;
        lVar8 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(long *)(lVar2 + 8 + lVar8) == -1);
    }
  }
  return SUB41(uVar11,0);
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}